

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

bool pdqsort_detail::
     partial_insertion_sort<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
               (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                begin,__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                      end,anon_class_8_1_8991fb9c comp)

{
  double dVar1;
  double dVar2;
  int iVar3;
  pointer ppVar4;
  pointer ppVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  double dVar12;
  double dVar13;
  pointer ppVar14;
  pointer ppVar15;
  ulong uVar16;
  FractionalInteger *pFVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  _Var22;
  long lVar23;
  long lVar24;
  FractionalInteger *pFVar25;
  bool local_89;
  
  if (begin._M_current == end._M_current) {
    local_89 = true;
  }
  else {
    lVar23 = 0;
    uVar19 = 0;
    _Var22._M_current = begin._M_current;
    do {
      pFVar25 = _Var22._M_current + 1;
      local_89 = pFVar25 == end._M_current;
      if (local_89) {
        return local_89;
      }
      iVar3 = _Var22._M_current[1].basisIndex;
      dVar1 = _Var22._M_current[1].fractionality;
      if (((_Var22._M_current)->fractionality < dVar1) ||
         (((_Var22._M_current)->fractionality <= dVar1 &&
          (uVar20 = (long)(_Var22._M_current)->basisIndex + (comp.this)->numTries,
          uVar16 = uVar20 & 0xffffffff, uVar20 = uVar20 >> 0x20,
          uVar18 = (comp.this)->numTries + (long)iVar3, uVar21 = uVar18 & 0xffffffff,
          uVar18 = uVar18 >> 0x20,
          ((uVar16 + 0x42d8680e260ae5b) * (uVar20 + 0x8a183895eeac1536) ^
          (uVar20 + 0x80c8963be3e4c2f3) * (uVar16 + 0xc8497d2a400d9551) >> 0x20) <
          ((uVar21 + 0x42d8680e260ae5b) * (uVar18 + 0x8a183895eeac1536) ^
          (uVar18 + 0x80c8963be3e4c2f3) * (uVar21 + 0xc8497d2a400d9551) >> 0x20))))) {
        dVar12 = _Var22._M_current[1].row_ep_norm2;
        dVar13 = _Var22._M_current[1].score;
        uVar6 = *(undefined4 *)&(_Var22._M_current)->fractionality;
        uVar7 = *(undefined4 *)((long)&(_Var22._M_current)->fractionality + 4);
        uVar8 = *(undefined4 *)&(_Var22._M_current)->row_ep_norm2;
        uVar9 = *(undefined4 *)((long)&(_Var22._M_current)->row_ep_norm2 + 4);
        uVar10 = *(undefined8 *)((long)&(_Var22._M_current)->row_ep_norm2 + 4);
        uVar11 = *(undefined8 *)((long)&(_Var22._M_current)->score + 4);
        ppVar14 = _Var22._M_current[1].row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar15 = _Var22._M_current[1].row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ppVar4 = _Var22._M_current[1].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        _Var22._M_current[1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        _Var22._M_current[1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        _Var22._M_current[1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        *(undefined8 *)((long)&_Var22._M_current[1].row_ep_norm2 + 4) = uVar10;
        *(undefined8 *)((long)&_Var22._M_current[1].score + 4) = uVar11;
        *(undefined4 *)&pFVar25->fractionality = uVar6;
        *(undefined4 *)((long)&_Var22._M_current[1].fractionality + 4) = uVar7;
        *(undefined4 *)&_Var22._M_current[1].row_ep_norm2 = uVar8;
        *(undefined4 *)((long)&_Var22._M_current[1].row_ep_norm2 + 4) = uVar9;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
        _M_move_assign(&_Var22._M_current[1].row_ep,&(_Var22._M_current)->row_ep);
        pFVar17 = pFVar25;
        lVar24 = lVar23;
        if (_Var22._M_current != begin._M_current) {
          do {
            _Var22._M_current =
                 (FractionalInteger *)((long)&(begin._M_current)->fractionality + lVar24);
            dVar2 = *(double *)((long)&begin._M_current[-1].fractionality + lVar24);
            if ((dVar1 <= dVar2) &&
               ((dVar1 < dVar2 ||
                (uVar20 = (long)*(int *)((long)begin._M_current + lVar24 + -0x20) +
                          (comp.this)->numTries, uVar16 = uVar20 & 0xffffffff,
                uVar20 = uVar20 >> 0x20, uVar18 = (comp.this)->numTries + (long)iVar3,
                uVar21 = uVar18 & 0xffffffff, uVar18 = uVar18 >> 0x20,
                ((uVar21 + 0x42d8680e260ae5b) * (uVar18 + 0x8a183895eeac1536) ^
                (uVar18 + 0x80c8963be3e4c2f3) * (uVar21 + 0xc8497d2a400d9551) >> 0x20) <=
                ((uVar16 + 0x42d8680e260ae5b) * (uVar20 + 0x8a183895eeac1536) ^
                (uVar20 + 0x80c8963be3e4c2f3) * (uVar16 + 0xc8497d2a400d9551) >> 0x20))))) break;
            uVar6 = *(undefined4 *)((long)&begin._M_current[-1].fractionality + lVar24);
            uVar7 = *(undefined4 *)((long)begin._M_current + lVar24 + -0x34);
            uVar8 = *(undefined4 *)((long)begin._M_current + lVar24 + -0x30);
            uVar9 = *(undefined4 *)((long)begin._M_current + lVar24 + -0x2c);
            uVar10 = *(undefined8 *)((long)begin._M_current + lVar24 + -0x24);
            *(undefined8 *)((long)&(_Var22._M_current)->row_ep_norm2 + 4) =
                 *(undefined8 *)((long)begin._M_current + lVar24 + -0x2c);
            *(undefined8 *)((long)&(_Var22._M_current)->score + 4) = uVar10;
            *(undefined4 *)&(_Var22._M_current)->fractionality = uVar6;
            *(undefined4 *)((long)&(_Var22._M_current)->fractionality + 4) = uVar7;
            *(undefined4 *)&(_Var22._M_current)->row_ep_norm2 = uVar8;
            *(undefined4 *)((long)&(_Var22._M_current)->row_ep_norm2 + 4) = uVar9;
            std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
            _M_move_assign((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            *)((long)&((begin._M_current)->row_ep).
                                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar24),
                           (long)begin._M_current + lVar24 + -0x18);
            lVar24 = lVar24 + -0x38;
            _Var22._M_current = begin._M_current;
          } while (lVar24 != 0);
          pFVar17 = (FractionalInteger *)((long)&begin._M_current[1].fractionality + lVar24);
        }
        (_Var22._M_current)->fractionality = dVar1;
        pFVar17[-1].row_ep_norm2 = dVar12;
        pFVar17[-1].score = dVar13;
        pFVar17[-1].basisIndex = iVar3;
        ppVar5 = pFVar17[-1].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pFVar17[-1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = ppVar14;
        pFVar17[-1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = ppVar15;
        pFVar17[-1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = ppVar4;
        if (ppVar5 != (pointer)0x0) {
          operator_delete(ppVar5);
        }
        uVar19 = uVar19 + ((long)pFVar25 - (long)_Var22._M_current >> 3) * 0x6db6db6db6db6db7;
      }
      lVar23 = lVar23 + 0x38;
      _Var22._M_current = pFVar25;
    } while (uVar19 < 9);
  }
  return local_89;
}

Assistant:

inline bool partial_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return true;
        
        std::size_t limit = 0;
        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
                limit += cur - sift;
            }
            
            if (limit > partial_insertion_sort_limit) return false;
        }

        return true;
    }